

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

void __thiscall QPDFLogger::warn(QPDFLogger *this,char *s)

{
  QPDFLogger local_20;
  
  getWarn(&local_20,SUB81(this,0));
  Pipeline::writeCStr((Pipeline *)
                      local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,s);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFLogger::warn(char const* s)
{
    getWarn(false)->writeCStr(s);
}